

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_merge_node_update(lyd_node *target,lyd_node *source)

{
  ly_ctx *ctx_00;
  int iVar1;
  hash_table *phVar2;
  lyd_node *plVar3;
  lyxml_elem *plVar4;
  int len;
  lyd_node_anydata *src_any;
  lyd_node_anydata *trg_any;
  lyd_node_leaf_list *src_leaf;
  lyd_node_leaf_list *trg_leaf;
  ly_ctx *ctx;
  lyd_node *source_local;
  lyd_node *target_local;
  
  if ((target->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) == LYS_UNKNOWN) {
    __assert_fail("target->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x9aa,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
  }
  ctx_00 = target->schema->module->ctx;
  if (ctx_00 == source->schema->module->ctx) {
    if (target->schema->nodetype == LYS_LEAF) {
      lydict_remove(ctx_00,(char *)target->ht);
      phVar2 = (hash_table *)lydict_insert(ctx_00,(char *)source->ht,0);
      target->ht = phVar2;
      *(undefined4 *)&target[1].schema = *(undefined4 *)&source[1].schema;
      if (*(int *)&target[1].schema == 9) {
        target->validity = target->validity | 8;
        lyp_parse_value((lys_type *)&target->schema[1].ref,(char **)&target->ht,(lyxml_elem *)0x0,
                        (lyd_node_leaf_list *)target,(lyd_attr *)0x0,(lys_module *)0x0,1,
                        (uint)(source->field_0x9 & 1),0);
      }
      else {
        lyd_free_value((lyd_val)target->child,*(LY_DATA_TYPE *)&target[1].schema,
                       *(uint8_t *)((long)&target[1].schema + 4),(lys_type *)&target->schema[1].ref,
                       (char *)target->ht,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
        target->child = source->child;
      }
      target->field_0x9 = target->field_0x9 & 0xfe | source->field_0x9 & 1;
      check_leaf_list_backlinks(target,2);
    }
    else {
      switch(*(undefined4 *)&target->field_0x34) {
      case 0:
      case 2:
      case 4:
        lydict_remove(ctx_00,(char *)target->ht);
        break;
      case 1:
      case 3:
      case 5:
      case 0x21:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x9da,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
      case 8:
        lyxml_free_withsiblings(ctx_00,(lyxml_elem *)target->ht);
        break;
      case 0x10:
        lyd_free_withsiblings((lyd_node *)target->ht);
        break;
      case 0x20:
        free(target->ht);
      }
      *(undefined4 *)&target->field_0x34 = *(undefined4 *)&source->field_0x34;
      target->ht = source->ht;
      *(undefined4 *)&source->field_0x34 = 0x10;
      source->ht = (hash_table *)0x0;
    }
  }
  else if (target->schema->nodetype == LYS_LEAF) {
    lydict_remove(ctx_00,(char *)target->ht);
    phVar2 = (hash_table *)lydict_insert(ctx_00,(char *)source->ht,0);
    target->ht = phVar2;
    lyd_free_value((lyd_val)target->child,*(LY_DATA_TYPE *)&target[1].schema,
                   *(uint8_t *)((long)&target[1].schema + 4),(lys_type *)&target->schema[1].ref,
                   (char *)target->ht,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
    *(undefined4 *)&target[1].schema = *(undefined4 *)&source[1].schema;
    target->field_0x9 = target->field_0x9 & 0xfe | source->field_0x9 & 1;
    switch(*(undefined4 *)&target[1].schema) {
    case 1:
    case 10:
      target->child = (lyd_node *)target->ht;
      break;
    case 2:
    case 6:
    case 7:
      lyp_parse_value((lys_type *)&target->schema[1].ref,(char **)&target->ht,(lyxml_elem *)0x0,
                      (lyd_node_leaf_list *)target,(lyd_attr *)0x0,(lys_module *)0x0,1,
                      (uint)(target->field_0x9 & 1),1);
      break;
    default:
      target->child = source->child;
      break;
    case 8:
      target->child = (lyd_node *)0x0;
      break;
    case 9:
      target->validity = target->validity | 8;
      lyp_parse_value((lys_type *)&target->schema[1].ref,(char **)&target->ht,(lyxml_elem *)0x0,
                      (lyd_node_leaf_list *)target,(lyd_attr *)0x0,(lys_module *)0x0,1,
                      (uint)(target->field_0x9 & 1),0);
      break;
    case 0xb:
      plVar3 = (lyd_node *)lydict_insert(ctx_00,(char *)source->child,0);
      target->child = plVar3;
    }
    check_leaf_list_backlinks(target,2);
  }
  else {
    switch(*(undefined4 *)&target->field_0x34) {
    case 0:
    case 2:
    case 4:
      lydict_remove(ctx_00,(char *)target->ht);
      break;
    case 1:
    case 3:
    case 5:
    case 0x21:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0xa2b,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
    case 8:
      lyxml_free_withsiblings(ctx_00,(lyxml_elem *)target->ht);
      break;
    case 0x10:
      lyd_free_withsiblings((lyd_node *)target->ht);
      break;
    case 0x20:
      free(target->ht);
    }
    *(undefined4 *)&target->field_0x34 = *(undefined4 *)&source->field_0x34;
    if (source->ht != (hash_table *)0x0) {
      switch(*(undefined4 *)&target->field_0x34) {
      case 0:
      case 2:
      case 4:
        phVar2 = (hash_table *)lydict_insert(ctx_00,(char *)source->ht,0);
        target->ht = phVar2;
        break;
      case 1:
      case 3:
      case 5:
      case 0x21:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0xa4d,"void lyd_merge_node_update(struct lyd_node *, struct lyd_node *)");
      case 8:
        plVar4 = lyxml_dup_elem(ctx_00,(lyxml_elem *)source->ht,(lyxml_elem *)0x0,1,1);
        target->ht = (hash_table *)plVar4;
        break;
      case 0x10:
        plVar3 = lyd_dup_withsiblings_to_ctx((lyd_node *)source->ht,1,ctx_00);
        target->ht = (hash_table *)plVar3;
        break;
      case 0x20:
        iVar1 = lyd_lyb_data_length((char *)source->ht);
        if (iVar1 == -1) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
          return;
        }
        phVar2 = (hash_table *)malloc((long)iVar1);
        target->ht = phVar2;
        if (target->ht == (hash_table *)0x0) {
          ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_merge_node_update")
          ;
          return;
        }
        memcpy(target->ht,source->ht,(long)iVar1);
      }
    }
  }
  return;
}

Assistant:

static void
lyd_merge_node_update(struct lyd_node *target, struct lyd_node *source)
{
    struct ly_ctx *ctx;
    struct lyd_node_leaf_list *trg_leaf, *src_leaf;
    struct lyd_node_anydata *trg_any, *src_any;
    int len;

    assert(target->schema->nodetype & (LYS_LEAF | LYS_ANYDATA));
    ctx = target->schema->module->ctx;

    if (ctx == source->schema->module->ctx) {
        /* source and targets are in the same context */
        if (target->schema->nodetype == LYS_LEAF) {
            trg_leaf = (struct lyd_node_leaf_list *)target;
            src_leaf = (struct lyd_node_leaf_list *)source;

            lydict_remove(ctx, trg_leaf->value_str);
            trg_leaf->value_str = lydict_insert(ctx, src_leaf->value_str, 0);
            trg_leaf->value_type = src_leaf->value_type;
            if (trg_leaf->value_type == LY_TYPE_LEAFREF) {
                trg_leaf->validity |= LYD_VAL_LEAFREF;
                lyp_parse_value(&((struct lys_node_leaf *)trg_leaf->schema)->type, &trg_leaf->value_str,
                                NULL, trg_leaf, NULL, NULL, 1, src_leaf->dflt, 0);
            } else {
                lyd_free_value(trg_leaf->value, trg_leaf->value_type, trg_leaf->value_flags,
                               &((struct lys_node_leaf *)trg_leaf->schema)->type, trg_leaf->value_str, NULL, NULL, NULL);
                trg_leaf->value = src_leaf->value;
            }
            trg_leaf->dflt = src_leaf->dflt;

            check_leaf_list_backlinks(target, 2);
        } else { /* ANYDATA */
            trg_any = (struct lyd_node_anydata *)target;
            src_any = (struct lyd_node_anydata *)source;

            switch(trg_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                lydict_remove(ctx, trg_any->value.str);
                break;
            case LYD_ANYDATA_DATATREE:
                lyd_free_withsiblings(trg_any->value.tree);
                break;
            case LYD_ANYDATA_XML:
                lyxml_free_withsiblings(ctx, trg_any->value.xml);
                break;
            case LYD_ANYDATA_LYB:
                free(trg_any->value.mem);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
            case LYD_ANYDATA_LYBD:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }

            trg_any->value_type = src_any->value_type;
            trg_any->value = src_any->value;

            src_any->value_type = LYD_ANYDATA_DATATREE;
            src_any->value.tree = NULL;
        }
    } else {
        /* we have different contexts for the target and source */
        if (target->schema->nodetype == LYS_LEAF) {
            trg_leaf = (struct lyd_node_leaf_list *)target;
            src_leaf = (struct lyd_node_leaf_list *)source;

            lydict_remove(ctx, trg_leaf->value_str);
            trg_leaf->value_str = lydict_insert(ctx, src_leaf->value_str, 0);
            lyd_free_value(trg_leaf->value, trg_leaf->value_type, trg_leaf->value_flags,
                           &((struct lys_node_leaf *)trg_leaf->schema)->type, trg_leaf->value_str, NULL, NULL, NULL);
            trg_leaf->value_type = src_leaf->value_type;
            trg_leaf->dflt = src_leaf->dflt;

            switch (trg_leaf->value_type) {
            case LY_TYPE_BINARY:
            case LY_TYPE_STRING:
                /* value_str pointer is shared in these cases */
                trg_leaf->value.string = trg_leaf->value_str;
                break;
            case LY_TYPE_LEAFREF:
                trg_leaf->validity |= LYD_VAL_LEAFREF;
                lyp_parse_value(&((struct lys_node_leaf *)trg_leaf->schema)->type, &trg_leaf->value_str,
                                NULL, trg_leaf, NULL, NULL, 1, trg_leaf->dflt, 0);
                break;
            case LY_TYPE_INST:
                trg_leaf->value.instance = NULL;
                break;
            case LY_TYPE_UNION:
                /* unresolved union (this must be non-validated tree), duplicate the stored string (duplicated
                 * because of possible change of the value in case of instance-identifier) */
                trg_leaf->value.string = lydict_insert(ctx, src_leaf->value.string, 0);
                break;
            case LY_TYPE_BITS:
            case LY_TYPE_ENUM:
            case LY_TYPE_IDENT:
                /* in case of duplicating bits (no matter if in the same context or not) or enum and identityref into
                 * a different context, searching for the type and duplicating the data is almost as same as resolving
                 * the string value, so due to a simplicity, parse the value for the duplicated leaf */
                lyp_parse_value(&((struct lys_node_leaf *)trg_leaf->schema)->type, &trg_leaf->value_str, NULL,
                                trg_leaf, NULL, NULL, 1, trg_leaf->dflt, 1);
                break;
            default:
                trg_leaf->value = src_leaf->value;
                break;
            }

            check_leaf_list_backlinks(target, 2);
        } else { /* ANYDATA */
            trg_any = (struct lyd_node_anydata *)target;
            src_any = (struct lyd_node_anydata *)source;

            switch(trg_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                lydict_remove(ctx, trg_any->value.str);
                break;
            case LYD_ANYDATA_DATATREE:
                lyd_free_withsiblings(trg_any->value.tree);
                break;
            case LYD_ANYDATA_XML:
                lyxml_free_withsiblings(ctx, trg_any->value.xml);
                break;
            case LYD_ANYDATA_LYB:
                free(trg_any->value.mem);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
            case LYD_ANYDATA_LYBD:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }

            trg_any->value_type = src_any->value_type;
            if ((void*)src_any->value.tree) {
                /* there is a value to duplicate */
                switch (trg_any->value_type) {
                case LYD_ANYDATA_CONSTSTRING:
                case LYD_ANYDATA_SXML:
                case LYD_ANYDATA_JSON:
                    trg_any->value.str = lydict_insert(ctx, src_any->value.str, 0);
                    break;
                case LYD_ANYDATA_DATATREE:
                    trg_any->value.tree = lyd_dup_withsiblings_to_ctx(src_any->value.tree, 1, ctx);
                    break;
                case LYD_ANYDATA_XML:
                    trg_any->value.xml = lyxml_dup_elem(ctx, src_any->value.xml, NULL, 1, 1);
                    break;
                case LYD_ANYDATA_LYB:
                    len = lyd_lyb_data_length(src_any->value.mem);
                    if (len == -1) {
                        LOGERR(ctx, LY_EINVAL, "Invalid LYB data.");
                        return;
                    }
                    trg_any->value.mem = malloc(len);
                    LY_CHECK_ERR_RETURN(!trg_any->value.mem, LOGMEM(ctx), );
                    memcpy(trg_any->value.mem, src_any->value.mem, len);
                    break;
                case LYD_ANYDATA_STRING:
                case LYD_ANYDATA_SXMLD:
                case LYD_ANYDATA_JSOND:
                case LYD_ANYDATA_LYBD:
                    /* dynamic strings are used only as input parameters */
                    assert(0);
                    break;
                }
            }
        }
    }
}